

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

LArYieldFluctuationResult * __thiscall
NEST::LArNEST::GetDefaultFluctuations
          (LArYieldFluctuationResult *__return_storage_ptr__,LArNEST *this,LArYieldResult *yields,
          double density)

{
  RandomGen *pRVar1;
  int64_t iVar2;
  double dVar3;
  double dVar4;
  double prob;
  double mean;
  double dVar5;
  double Nq_mean;
  double Nion;
  double Nex;
  double Nq;
  double alf;
  double p_r;
  double NexOverNion;
  double Fano;
  double density_local;
  LArYieldResult *yields_local;
  LArNEST *this_local;
  
  dVar3 = yields->Nex / yields->Nion;
  dVar4 = (yields->Nph - yields->Nex) / yields->Nion;
  prob = 1.0 / (dVar3 + 1.0);
  mean = yields->Ne + yields->Nph;
  if ((yields->Lindhard != 1.0) || (NAN(yields->Lindhard))) {
    pRVar1 = RandomGen::rndm();
    dVar5 = sqrt(mean * 0.1115 * prob);
    dVar5 = RandomGen::rand_gauss(pRVar1,mean * prob,dVar5,true);
    Nq_mean = floor(dVar5 + 0.5);
    pRVar1 = RandomGen::rndm();
    dVar5 = sqrt(mean * 0.1115 * prob * dVar3);
    dVar3 = RandomGen::rand_gauss(pRVar1,mean * prob * dVar3,dVar5,true);
    Nion = floor(dVar3 + 0.5);
    if (Nion < 0.0) {
      Nion = 0.0;
    }
    if (Nq_mean < 0.0) {
      Nq_mean = 0.0;
    }
  }
  else {
    pRVar1 = RandomGen::rndm();
    dVar3 = sqrt(mean * 0.1115);
    dVar3 = RandomGen::rand_gauss(pRVar1,mean,dVar3,true);
    Nex = floor(dVar3 + 0.5);
    if (Nex < 0.0) {
      Nex = 0.0;
    }
    pRVar1 = RandomGen::rndm();
    iVar2 = RandomGen::binom_draw(pRVar1,(long)Nex,prob);
    Nq_mean = (double)iVar2;
    if (Nex < Nq_mean) {
      Nq_mean = Nex;
    }
    Nion = Nex - Nq_mean;
  }
  __return_storage_ptr__->NphFluctuation = dVar4 * Nq_mean + Nion;
  __return_storage_ptr__->NeFluctuation = (1.0 - dVar4) * Nq_mean;
  __return_storage_ptr__->NexFluctuation = Nion;
  __return_storage_ptr__->NionFluctuation = Nq_mean;
  return __return_storage_ptr__;
}

Assistant:

LArYieldFluctuationResult LArNEST::GetDefaultFluctuations(
    const LArYieldResult &yields, double density) {
  double Fano = 0.1115;
  double NexOverNion = yields.Nex / yields.Nion;
  double p_r = (yields.Nph - yields.Nex) / yields.Nion;
  double alf = 1. / (1. + NexOverNion);
  double Nq = 0;
  double Nex = 0;
  double Nion = 0;
  double Nq_mean = yields.Ne + yields.Nph;
  // If nuclear recoils
  if (yields.Lindhard == 1.) {
    Nq = floor(
        RandomGen::rndm()->rand_gauss(Nq_mean, sqrt(Fano * Nq_mean), true) +
        0.5);
    if (Nq < 0.) {
      Nq = 0.;
    }
    Nion = double(RandomGen::rndm()->binom_draw(Nq, alf));
    if (Nion > Nq) {
      Nion = Nq;
    }
    Nex = Nq - Nion;
    // otherwise
  } else {
    Nion = floor(RandomGen::rndm()->rand_gauss(
                     Nq_mean * alf, sqrt(Fano * Nq_mean * alf), true) +
                 0.5);
    Nex = floor(RandomGen::rndm()->rand_gauss(
                    Nq_mean * alf * NexOverNion,
                    sqrt(Fano * Nq_mean * alf * NexOverNion), true) +
                0.5);
    if (Nex < 0.) {
      Nex = 0.;
    }
    if (Nion < 0.) {
      Nion = 0.;
    }
    Nq = Nion + Nex;
  }
  LArYieldFluctuationResult result{Nex + p_r * Nion, (1. - p_r) * Nion, Nex,
                                   Nion};
  return result;
}